

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

int __thiscall
CVmObjByteArray::getp_fill_val
          (CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong cnt;
  ulong start_idx;
  uint uVar4;
  
  if (in_argc == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *in_argc;
  }
  if (getp_fill_val(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_fill_val();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_fill_val::desc);
  if (iVar1 != 0) {
    return 1;
  }
  uVar2 = CVmBif::pop_int_val();
  if (0xff < uVar2) {
    err_throw(0x7eb);
  }
  start_idx = 1;
  if (1 < uVar4) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 == 0) {
      start_idx = 1;
    }
    else {
      start_idx = (ulong)*(uint *)(this->super_CVmObject).ext_ + 1;
      if ((ulong)(long)iVar1 <= start_idx) {
        start_idx = (long)iVar1;
      }
    }
    if (uVar4 != 2) {
      iVar1 = CVmBif::pop_int_val();
      cnt = (ulong)iVar1;
      uVar3 = (ulong)*(uint *)(this->super_CVmObject).ext_;
      goto LAB_0026cb2f;
    }
  }
  uVar3 = (ulong)*(uint *)(this->super_CVmObject).ext_;
  cnt = uVar3;
LAB_0026cb2f:
  if (uVar3 < start_idx) {
    cnt = 0;
  }
  else if (uVar3 < (start_idx + cnt) - 1) {
    cnt = (uVar3 - start_idx) + 1;
  }
  save_undo(this,self,start_idx,cnt);
  fill_with(this,(uchar)uVar2,start_idx,cnt);
  retval->typ = VM_OBJ;
  (retval->val).obj = self;
  return 1;
}

Assistant:

int CVmObjByteArray::getp_fill_val(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *in_argc)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1, 2);
    unsigned long idx;
    unsigned long cnt;
    long fill_val;

    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the value with which to fill elements */
    fill_val = CVmBif::pop_int_val(vmg0_);
    if (fill_val < 0 || fill_val > 255)
        err_throw(VMERR_OUT_OF_RANGE);

    /* get the starting index, if provided */
    if (argc >= 2)
    {
        /* get the index */
        idx = CVmBif::pop_int_val(vmg0_);

        /* force it to be in range */
        if (idx < 1)
            idx = 1;
        else if (idx > get_element_count() + 1)
            idx = get_element_count() + 1;
    }
    else
    {
        /* fill from the first element */
        idx = 1;
    }

    /* get the count, if provided */
    if (argc >= 3)
    {
        /* get the count */
        cnt = CVmBif::pop_int_val(vmg0_);
    }
    else
    {
        /* fill the entire array */
        cnt = get_element_count();
    }

    /* force the length to be in range */
    if (idx > get_element_count())
        cnt = 0;
    else if (idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - idx;

    /* save undo for the change */
    save_undo(vmg_ self, idx, cnt);

    /* fill with the given value */
    fill_with((unsigned char)fill_val, idx, cnt);

    /* the result is 'self' */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}